

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

FT_Error cff_builder_start_point(CFF_Builder *builder,FT_Pos x,FT_Pos y)

{
  FT_Error FVar1;
  
  FVar1 = 0;
  if (builder->path_begun == '\0') {
    builder->path_begun = '\x01';
    FVar1 = cff_builder_add_contour(builder);
    if (FVar1 == 0) {
      FVar1 = cff_builder_add_point1(builder,x,y);
      return FVar1;
    }
  }
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_builder_start_point( CFF_Builder*  builder,
                           FT_Pos        x,
                           FT_Pos        y )
  {
    FT_Error  error = FT_Err_Ok;


    /* test whether we are building a new contour */
    if ( !builder->path_begun )
    {
      builder->path_begun = 1;
      error = cff_builder_add_contour( builder );
      if ( !error )
        error = cff_builder_add_point1( builder, x, y );
    }

    return error;
  }